

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorFactory.cpp
# Opt level: O0

Integrator * __thiscall
OpenMD::IntegratorFactory::createIntegrator(IntegratorFactory *this,string *id,SimInfo *info)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  undefined4 extraout_var;
  undefined8 in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>_>
  *in_RDI;
  iterator i;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  Integrator *local_8;
  
  local_20 = in_RDX;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>_>
       ::find(in_RDI,(key_type *)0x277506);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>_>
       ::end(in_RDI);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::IntegratorCreator_*>_>
                           *)0x277538);
    iVar2 = (*ppVar3->second->_vptr_IntegratorCreator[2])(ppVar3->second,local_20);
    local_8 = (Integrator *)CONCAT44(extraout_var,iVar2);
  }
  else {
    local_8 = (Integrator *)0x0;
  }
  return local_8;
}

Assistant:

Integrator* IntegratorFactory::createIntegrator(const std::string& id,
                                                  SimInfo* info) {
    CreatorMapType::iterator i = creatorMap_.find(id);
    if (i != creatorMap_.end()) {
      // invoke functor to create object
      return (i->second)->create(info);
    } else {
      return NULL;
    }
  }